

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall
soul::StructuralParser::checkAndCreateArrayElementRef
          (StructuralParser *this,Context *c,Expression *lhs,pool_ptr<soul::AST::Expression> *start,
          pool_ptr<soul::AST::Expression> *end)

{
  ExpressionKind EVar1;
  Expression *pEVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ArrayElementRef *pAVar6;
  pool_ptr<soul::AST::Constant> endConst;
  pool_ptr<soul::AST::Constant> startConst;
  long local_1c0;
  Context *local_1b8;
  long local_1b0;
  PackedData local_1a8;
  pool_ptr<soul::AST::Expression> local_190;
  pool_ptr<soul::AST::Expression> local_188;
  CompileMessage local_180;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  EVar1 = lhs->kind;
  if ((((EVar1 & ~unknown) != value) && (EVar1 != endpoint)) && (EVar1 != unknown)) {
    CompileMessageHelpers::createMessage<>(&local_68,syntax,error,"Expected a value or endpoint");
    AST::Context::throwError(&(lhs->super_Statement).super_ASTObject.context,&local_68,false);
  }
  local_188 = (pool_ptr<soul::AST::Expression>)start->object;
  if ((local_188.object != (Expression *)0x0) && (((local_188.object)->kind & ~unknown) != value)) {
    CompileMessageHelpers::createMessage<>(&local_a0,syntax,error,"Expected a value");
    AST::Context::throwError
              (&((local_188.object)->super_Statement).super_ASTObject.context,&local_a0,false);
  }
  pEVar2 = end->object;
  local_1b8 = c;
  if ((pEVar2 != (Expression *)0x0) && ((pEVar2->kind & ~unknown) != value)) {
    CompileMessageHelpers::createMessage<>(&local_d8,syntax,error,"Expected a value");
    AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_d8,false);
  }
  bVar3 = AST::isResolvedAsConstant(&local_188);
  if (bVar3) {
    local_190 = (pool_ptr<soul::AST::Expression>)end->object;
    bVar3 = AST::isResolvedAsConstant(&local_190);
    if (bVar3) {
      if (start->object == (Expression *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      (*(start->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_1b0);
      if (end->object == (Expression *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      (*(end->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_1c0);
      if (local_1b0 != 0) {
        if (*(int *)(local_1b0 + 0x34) - 7U < 2) {
          if (local_1c0 != 0) {
            if (*(int *)(local_1c0 + 0x34) - 7U < 2) {
              soul::Value::getData(&local_1a8,(Value *)(local_1b0 + 0x30));
              uVar4 = soul::Value::PackedData::getAsInt64(&local_1a8);
              if (local_1c0 != 0) {
                soul::Value::getData(&local_1a8,(Value *)(local_1c0 + 0x30));
                uVar5 = soul::Value::PackedData::getAsInt64(&local_1a8);
                if (((long)uVar4 < (long)uVar5 || (long)(uVar5 | uVar4) < 0) &&
                   (-1 < (long)(uVar5 & uVar4) || (long)uVar4 < (long)uVar5)) goto LAB_001f4b15;
                pEVar2 = end->object;
                if (pEVar2 != (Expression *)0x0) {
                  CompileMessageHelpers::createMessage<>
                            (&local_180,syntax,error,"Invalid array slice range");
                  AST::Context::throwError
                            (&(pEVar2->super_Statement).super_ASTObject.context,&local_180,false);
                }
              }
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
            pEVar2 = end->object;
            if (pEVar2 != (Expression *)0x0) {
              CompileMessageHelpers::createMessage<>(&local_148,syntax,error,"Expected an integer");
              AST::Context::throwError
                        (&(pEVar2->super_Statement).super_ASTObject.context,&local_148,false);
            }
          }
        }
        else {
          pEVar2 = start->object;
          if (pEVar2 != (Expression *)0x0) {
            CompileMessageHelpers::createMessage<>(&local_110,syntax,error,"Expected an integer");
            AST::Context::throwError
                      (&(pEVar2->super_Statement).super_ASTObject.context,&local_110,false);
          }
        }
      }
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
  }
LAB_001f4b15:
  local_1a8.type._0_1_ = 1;
  pAVar6 = PoolAllocator::
           allocate<soul::AST::ArrayElementRef,soul::AST::Context_const&,soul::AST::Expression&,soul::pool_ptr<soul::AST::Expression>&,soul::pool_ptr<soul::AST::Expression>&,bool>
                     (&this->allocator->pool,local_1b8,lhs,start,end,(bool *)&local_1a8);
  return &pAVar6->super_Expression;
}

Assistant:

AST::Expression& checkAndCreateArrayElementRef (const AST::Context& c, AST::Expression& lhs,
                                                    pool_ptr<AST::Expression> start,
                                                    pool_ptr<AST::Expression> end)
    {
        if (! (AST::isPossiblyValue (lhs) || AST::isPossiblyEndpoint (lhs)))
            lhs.context.throwError (Errors::expectedValueOrEndpoint());

        if (start != nullptr && ! AST::isPossiblyValue (start))   start->context.throwError (Errors::expectedValue());
        if (end != nullptr   && ! AST::isPossiblyValue (end))     end->context.throwError (Errors::expectedValue());

        if (AST::isResolvedAsConstant (start) && AST::isResolvedAsConstant (end))
        {
            auto startConst = start->getAsConstant();
            auto endConst = end->getAsConstant();

            if (! startConst->value.getType().isInteger())  start->context.throwError (Errors::expectedInteger());
            if (! endConst->value.getType().isInteger())    end->context.throwError (Errors::expectedInteger());

            auto s = startConst->value.getAsInt64();
            auto e = endConst->value.getAsInt64();

            if ((s >= 0 && e >= 0 && s >= e) || (s < 0 && e < 0 && s >= e))
                end->context.throwError (Errors::illegalSliceSize());
        }

        return allocate<AST::ArrayElementRef> (c, lhs, start, end, true);
    }